

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_l10n.c
# Opt level: O0

void test_l10n_simple(CuTest *tc)

{
  char *actual;
  undefined1 local_50 [8];
  l10n_text txt;
  char buffer [32];
  CuTest *tc_local;
  
  memset(local_50,0,0x18);
  l10n_text_assign((l10n_text *)local_50,"$name\'s blog (%num stars)","$name","Enno","%num",0x2a,0);
  actual = l10n_text_render((l10n_text *)local_50,(char *)&txt.args,0x20);
  CuAssertPtrEquals_LineMsg
            (tc,"/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_l10n.c",
             0x36,(char *)0x0,&txt.args,actual);
  CuAssertStrEquals_LineMsg
            (tc,"/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_l10n.c",
             0x37,(char *)0x0,"Enno\'s blog (42 stars)",(char *)&txt.args);
  l10n_text_free((l10n_text *)local_50);
  return;
}

Assistant:

static void test_l10n_simple(CuTest * tc)
{
    char buffer[32];
    l10n_text txt = { NULL, 0, 0 };

    l10n_text_assign(&txt, "$name's blog (%num stars)", "$name", "Enno", "%num", 42, NULL);
    CuAssertPtrEquals(tc, buffer, l10n_text_render(&txt, buffer, sizeof(buffer)));
    CuAssertStrEquals(tc, "Enno's blog (42 stars)", buffer);
    l10n_text_free(&txt);
}